

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovPlatform.cpp
# Opt level: O1

cl_int cov::getPlatformInfo
                 (cl_platform_id platform,cl_platform_info paramName,size_t paramValueSize,
                 void *paramValue,size_t *paramValueSizeRet)

{
  ulong uVar1;
  cl_int cVar2;
  cl_platform_id p_Var3;
  
  cVar2 = -0x1e;
  switch(paramName) {
  case 0x900:
    if (paramValueSizeRet != (size_t *)0x0) {
      *paramValueSizeRet = *(size_t *)(platform + 0x18);
    }
    if (paramValue == (void *)0x0) {
      return 0;
    }
    uVar1 = *(ulong *)(platform + 0x18);
    if (paramValueSize < uVar1) {
      return -0x1e;
    }
    p_Var3 = platform + 0x10;
    break;
  case 0x901:
    if (paramValueSizeRet != (size_t *)0x0) {
      *paramValueSizeRet = *(size_t *)(platform + 0x38);
    }
    if (paramValue == (void *)0x0) {
      return 0;
    }
    uVar1 = *(ulong *)(platform + 0x38);
    if (paramValueSize < uVar1) {
      return -0x1e;
    }
    p_Var3 = platform + 0x30;
    break;
  case 0x902:
    if (paramValueSizeRet != (size_t *)0x0) {
      *paramValueSizeRet = *(size_t *)(platform + 0x58);
    }
    if (paramValue == (void *)0x0) {
      return 0;
    }
    uVar1 = *(ulong *)(platform + 0x58);
    if (paramValueSize < uVar1) {
      return -0x1e;
    }
    p_Var3 = platform + 0x50;
    break;
  case 0x903:
    if (paramValueSizeRet != (size_t *)0x0) {
      *paramValueSizeRet = *(size_t *)(platform + 0x78);
    }
    if (paramValue == (void *)0x0) {
      return 0;
    }
    uVar1 = *(ulong *)(platform + 0x78);
    if (paramValueSize < uVar1) {
      return -0x1e;
    }
    p_Var3 = platform + 0x70;
    break;
  case 0x904:
    if (paramValueSizeRet != (size_t *)0x0) {
      *paramValueSizeRet = *(size_t *)(platform + 0x98);
    }
    if (paramValue == (void *)0x0) {
      return 0;
    }
    uVar1 = *(ulong *)(platform + 0x98);
    if (paramValueSize < uVar1) {
      return -0x1e;
    }
    p_Var3 = platform + 0x90;
    break;
  default:
    goto switchD_00102e0c_default;
  }
  cVar2 = 0;
  std::__cxx11::string::copy((char *)p_Var3,(ulong)paramValue,uVar1);
switchD_00102e0c_default:
  return cVar2;
}

Assistant:

cl_int getPlatformInfo(cl_platform_id platform,
                       cl_platform_info paramName,
                       size_t paramValueSize,
                       void* paramValue,
                       size_t* paramValueSizeRet)
{
    auto p = reinterpret_cast<Platform*>(platform);
    switch (paramName) {
        case CL_PLATFORM_PROFILE:
            return utils::getStringParam(p->m_profile, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_VERSION:
            return utils::getStringParam(p->m_version, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_NAME:
            return utils::getStringParam(p->m_name, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_VENDOR:
            return utils::getStringParam(p->m_vendor, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_EXTENSIONS:
            return utils::getStringParam(p->m_extensions, paramValueSize, paramValue, paramValueSizeRet);
        default:
            return CL_INVALID_VALUE;
    }
}